

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall Catch::Approx::equalityComparisonImpl(Approx *this,double other)

{
  double lhs;
  double dVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  double *in_RDI;
  double in_XMM0_Qa;
  double local_48;
  bool local_11;
  
  bVar3 = anon_unknown.dwarf_18d5be::marginComparison(in_RDI[3],in_XMM0_Qa,in_RDI[1]);
  local_11 = true;
  if (!bVar3) {
    lhs = in_RDI[3];
    dVar1 = *in_RDI;
    dVar2 = in_RDI[2];
    uVar4 = std::isinf(in_RDI[3]);
    if ((uVar4 & 1) == 0) {
      local_48 = in_RDI[3];
    }
    else {
      local_48 = 0.0;
    }
    local_11 = anon_unknown.dwarf_18d5be::marginComparison
                         (lhs,in_XMM0_Qa,dVar1 * (dVar2 + ABS(local_48)));
  }
  return local_11;
}

Assistant:

bool Approx::equalityComparisonImpl(const double other) const {
        // First try with fixed margin, then compute margin based on epsilon, scale and Approx's value
        // Thanks to Richard Harris for his help refining the scaled margin value
        return marginComparison(m_value, other, m_margin)
            || marginComparison(m_value, other, m_epsilon * (m_scale + std::fabs(std::isinf(m_value)? 0 : m_value)));
    }